

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O0

void nn_cipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_cipc *cipc;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    iVar1 = nn_sipc_isidle((nn_sipc *)0x13e318);
    if (iVar1 == 0) {
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
      nn_sipc_stop((nn_sipc *)0x13e346);
    }
    *(undefined4 *)(local_28 + 0x58) = 8;
  }
  if (*(int *)(local_28 + 0x58) == 8) {
    iVar1 = nn_sipc_isidle((nn_sipc *)0x13e37c);
    if (iVar1 == 0) {
      return;
    }
    nn_backoff_stop((nn_backoff *)0x13e397);
    nn_usock_stop((nn_usock *)0x13e3a5);
    *(undefined4 *)(local_28 + 0x58) = 9;
  }
  if (*(int *)(local_28 + 0x58) == 9) {
    iVar1 = nn_backoff_isidle((nn_backoff *)0x13e3db);
    if ((iVar1 != 0) && (iVar1 = nn_usock_isidle((nn_usock *)0x13e3ee), iVar1 != 0)) {
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped_noevent((nn_fsm *)0x13e40e);
      nn_ep_stopped((nn_ep *)0x13e41c);
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
          ,0xb5);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_cipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cipc *cipc;

    cipc = nn_cont (self, struct nn_cipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sipc_isidle (&cipc->sipc)) {
            nn_ep_stat_increment (cipc->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sipc_stop (&cipc->sipc);
        }
        cipc->state = NN_CIPC_STATE_STOPPING_SIPC_FINAL;
    }
    if (nn_slow (cipc->state == NN_CIPC_STATE_STOPPING_SIPC_FINAL)) {
        if (!nn_sipc_isidle (&cipc->sipc))
            return;
        nn_backoff_stop (&cipc->retry);
        nn_usock_stop (&cipc->usock);
        cipc->state = NN_CIPC_STATE_STOPPING;
    }
    if (nn_slow (cipc->state == NN_CIPC_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&cipc->retry) ||
              !nn_usock_isidle (&cipc->usock))
            return;
        cipc->state = NN_CIPC_STATE_IDLE;
        nn_fsm_stopped_noevent (&cipc->fsm);
        nn_ep_stopped (cipc->ep);
        return;
    }

    nn_fsm_bad_state(cipc->state, src, type);
}